

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O0

size_t nowide::basic_stackstring<char,_wchar_t,_10UL>::get_space
                 (size_t insize,size_t outsize,size_t in)

{
  size_t in_local;
  size_t outsize_local;
  size_t insize_local;
  
  insize_local = in;
  if (outsize < insize) {
    if ((insize == 2) && (outsize == 1)) {
      insize_local = in * 3;
    }
    else if ((insize == 4) && (outsize == 1)) {
      insize_local = in << 2;
    }
    else {
      insize_local = in << 1;
    }
  }
  return insize_local;
}

Assistant:

static size_t get_space(size_t insize,size_t outsize,size_t in)
    {
        if(insize <= outsize)
            return in;
        else if(insize == 2 && outsize == 1) 
            return 3 * in;
        else if(insize == 4 && outsize == 1) 
            return 4 * in;
        else  // if(insize == 4 && outsize == 2) 
            return 2 * in;
    }